

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O2

LiteralSelector *
Kernel::LiteralSelector::getSelector(Ordering *ordering,Options *options,int selectorNumber)

{
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
  *this;
  undefined *puVar1;
  undefined **ppuVar2;
  InvalidOperationException *this_00;
  int iVar3;
  
  iVar3 = -selectorNumber;
  if (0 < selectorNumber) {
    iVar3 = selectorNumber;
  }
  switch(iVar3) {
  case 0:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x20);
    (this->super_LiteralSelector)._ord = ordering;
    (this->super_LiteralSelector)._opt = options;
    (this->super_LiteralSelector)._reversePolarity = false;
    ppuVar2 = &PTR__LiteralSelector_009fe300;
    goto LAB_0043ef03;
  case 1:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x20);
    (this->super_LiteralSelector)._ord = ordering;
    (this->super_LiteralSelector)._opt = options;
    (this->super_LiteralSelector)._reversePolarity = false;
    puVar1 = &MaximalLiteralSelector::vtable;
LAB_0043eeff:
    ppuVar2 = (undefined **)(puVar1 + 0x10);
LAB_0043ef03:
    (this->super_LiteralSelector)._vptr_LiteralSelector = (_func_int **)ppuVar2;
    break;
  case 2:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x70);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
                *)this,ordering,options);
    break;
  case 3:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0xb0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)this,ordering,options);
    break;
  case 4:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0xd0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
    ::CompleteBestLiteralSelector(this,ordering,options);
    break;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
switchD_0043ecbd_caseD_5:
    this_00 = (InvalidOperationException *)__cxa_allocate_exception(0x28);
    Lib::InvalidOperationException::InvalidOperationException
              (this_00,"Undefined selection function");
    __cxa_throw(this_00,&Lib::InvalidOperationException::typeinfo,Lib::Exception::~Exception);
  case 10:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0xb0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)this,ordering,options);
    break;
  case 0xb:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x30);
    LookaheadLiteralSelector::LookaheadLiteralSelector
              ((LookaheadLiteralSelector *)this,true,ordering,options);
    break;
  case 0x14:
  case 0x15:
  case 0x16:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x20);
    iVar3 = iVar3 + -0x14;
    (this->super_LiteralSelector)._ord = ordering;
    (this->super_LiteralSelector)._opt = options;
    (this->super_LiteralSelector)._reversePolarity = false;
    puVar1 = &SpassLiteralSelector::vtable;
    goto LAB_0043ed3f;
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
    this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
            *)::operator_new(0x20);
    iVar3 = iVar3 + -0x1e;
    (this->super_LiteralSelector)._ord = ordering;
    (this->super_LiteralSelector)._opt = options;
    (this->super_LiteralSelector)._reversePolarity = false;
    puVar1 = &ELiteralSelector::vtable;
LAB_0043ed3f:
    (this->super_LiteralSelector)._vptr_LiteralSelector = (_func_int **)(puVar1 + 0x10);
    *(int *)&(this->super_LiteralSelector).field_0x1c = iVar3;
    break;
  default:
    switch(iVar3) {
    case 0x3ea:
      this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
              *)::operator_new(0x70);
      BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
      ::BestLiteralSelector
                ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
                  *)this,ordering,options);
      break;
    case 0x3eb:
      this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
              *)::operator_new(0xb0);
      BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::BestLiteralSelector
                ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                  *)this,ordering,options);
      break;
    case 0x3ec:
      this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
              *)::operator_new(0xd0);
      BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
      ::BestLiteralSelector
                ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
                  *)this,ordering,options);
      break;
    case 0x3ed:
    case 0x3ee:
    case 0x3ef:
    case 0x3f0:
    case 0x3f1:
      goto switchD_0043ecbd_caseD_5;
    case 0x3f2:
      this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
              *)::operator_new(0xb0);
      BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
      ::BestLiteralSelector
                ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                  *)this,ordering,options);
      break;
    case 0x3f3:
      this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
              *)::operator_new(0x30);
      LookaheadLiteralSelector::LookaheadLiteralSelector
                ((LookaheadLiteralSelector *)this,false,ordering,options);
      break;
    default:
      if (iVar3 == 0x29a) {
        this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
                *)::operator_new(0x20);
        (this->super_LiteralSelector)._ord = ordering;
        (this->super_LiteralSelector)._opt = options;
        *(undefined2 *)&(this->super_LiteralSelector)._reversePolarity = 0x100;
      }
      else {
        if (iVar3 != 0x682) goto switchD_0043ecbd_caseD_5;
        this = (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
                *)::operator_new(0x20);
        (this->super_LiteralSelector)._ord = ordering;
        (this->super_LiteralSelector)._opt = options;
        *(undefined2 *)&(this->super_LiteralSelector)._reversePolarity = 0;
      }
      puVar1 = &RndLiteralSelector::vtable;
      goto LAB_0043eeff;
    }
  }
  if (selectorNumber < 0) {
    (*(this->super_LiteralSelector)._vptr_LiteralSelector[3])(this,1);
  }
  return &this->super_LiteralSelector;
}

Assistant:

LiteralSelector* LiteralSelector::getSelector(const Ordering& ordering, const Options& options, int selectorNumber)
{
  using namespace LiteralComparators;

  typedef Composite<ColoredFirst,
	    Composite<MaximalSize,
	    LexComparator> > Comparator2;

  typedef Composite<ColoredFirst,
	    Composite<NoPositiveEquality,
	    Composite<LeastTopLevelVariables,
	    Composite<LeastDistinctVariables, LexComparator> > > > Comparator3;

  typedef Composite<ColoredFirst,
	    Composite<NoPositiveEquality,
	    Composite<LeastTopLevelVariables,
	    Composite<LeastVariables,
	    Composite<MaximalSize, LexComparator> > > > > Comparator4;

  typedef Composite<ColoredFirst,
	    Composite<NegativeEquality,
	    Composite<MaximalSize,
	    Composite<Negative, LexComparator> > > > Comparator10;

  int absNum = abs(selectorNumber);

  LiteralSelector* res;
  switch(absNum) {
  case 0: res = new TotalLiteralSelector(ordering, options); break;
  case 1: res = new MaximalLiteralSelector(ordering, options); break;
  case 2: res = new CompleteBestLiteralSelector<Comparator2>(ordering, options); break;
  case 3: res = new CompleteBestLiteralSelector<Comparator3>(ordering, options); break;
  case 4: res = new CompleteBestLiteralSelector<Comparator4>(ordering, options); break;
  case 10: res = new CompleteBestLiteralSelector<Comparator10>(ordering, options); break;

  case 11: res = new LookaheadLiteralSelector(true, ordering, options); break;

  case 20:
  case 21:
  case 22:
    res = new SpassLiteralSelector(ordering, options,static_cast<SpassLiteralSelector::Values>(absNum-20));
    break;

  case 30:
  case 31:
  case 32:
  case 33:
  case 34:
  case 35:
    res = new ELiteralSelector(ordering, options,static_cast<ELiteralSelector::Values>(absNum-30));
    break;

  case 666: res = new RndLiteralSelector(ordering, options,true /*complete*/); break;

  case 1002: res = new BestLiteralSelector<Comparator2>(ordering, options); break;
  case 1003: res = new BestLiteralSelector<Comparator3>(ordering, options); break;
  case 1004: res = new BestLiteralSelector<Comparator4>(ordering, options); break;
  case 1010: res = new BestLiteralSelector<Comparator10>(ordering, options); break;
  case 1011: res = new LookaheadLiteralSelector(false, ordering, options); break;
  case 1666: res = new RndLiteralSelector(ordering, options,false /*incomplete*/); break;

  default:
    INVALID_OPERATION("Undefined selection function");
  }
  if(selectorNumber<0) {
    res->setReversePolarity(true);
  }
  return res;
}